

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O0

int __thiscall Qclass::execute(Qclass *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  int local_244;
  int i;
  int start_state;
  long local_230;
  ofstream outfile;
  int local_2c;
  int goal_state;
  int action;
  double max;
  int local_18;
  int last_state;
  int start_y;
  int start_x;
  Qclass *this_local;
  
  last_state = 0x2f;
  local_18 = 0x2f;
  max._4_4_ = 5000;
  local_2c = 0;
  iVar1 = findState(this,this->goal_x,this->goal_y);
  std::ofstream::ofstream(&local_230);
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((char *)&local_230,0x18a5d0);
  poVar3 = std::operator<<((ostream *)&std::cout,"The path followed by the robot is:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ios_base::precision((ios_base *)((long)&local_230 + *(long *)(local_230 + -0x18)),6);
  while (_goal_state = -10000.0, max._4_4_ != iVar1) {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,last_state);
    poVar3 = std::operator<<(poVar3,",");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_18);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    pvVar4 = (void *)std::ostream::operator<<(&local_230,std::fixed);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,last_state);
    poVar3 = std::operator<<(poVar3,"   ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::fixed);
    std::ostream::operator<<(pvVar4,local_18);
    std::ostream::operator<<(&local_230,std::endl<char,std::char_traits<char>>);
    iVar2 = findState(this,last_state,local_18);
    for (local_244 = 0; local_244 < 4; local_244 = local_244 + 1) {
      if (_goal_state <= this->Q[iVar2][local_244]) {
        _goal_state = this->Q[iVar2][local_244];
        local_2c = local_244;
      }
    }
    this->Q[iVar2][local_2c] = -1000.0;
    if (local_2c == 0) {
      last_state = last_state + 1;
    }
    if (local_2c == 1) {
      last_state = last_state + -1;
    }
    if (local_2c == 2) {
      local_18 = local_18 + 1;
    }
    if (local_2c == 3) {
      local_18 = local_18 + -1;
    }
    max._4_4_ = findState(this,last_state,local_18);
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->goal_x);
  poVar3 = std::operator<<(poVar3,",");
  std::ostream::operator<<(poVar3,this->goal_y);
  pvVar4 = (void *)std::ostream::operator<<(&local_230,std::fixed);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,this->goal_x);
  poVar3 = std::operator<<(poVar3,"   ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::fixed);
  std::ostream::operator<<(pvVar4,this->goal_y);
  std::ofstream::close();
  std::ofstream::~ofstream(&local_230);
  return 0;
}

Assistant:

int Qclass::execute() {   // Executes the learned algorithm for given start
  int start_x = 47;
  int start_y = 47;
  int last_state = 5000;
  double max = -10000;
  int action = 0;
  int goal_state = findState(goal_x, goal_y);
  std::ofstream outfile;
  outfile.open("Co_ordinates.txt", std::ios::out | std::ios::trunc);
  std::cout << "The path followed by the robot is:" << std::endl;
  outfile.precision(6);
  while (last_state != goal_state) {
    int start_state;
    std::cout << start_x << "," << start_y << std::endl;
    outfile << std::fixed << start_x << "   " << std::fixed << start_y;
    outfile << std::endl;
    start_state = findState(start_x, start_y);
    for (int i = 0; i < 4; i++) {
      if (Q[start_state][i] >= max) {
        max = Q[start_state][i];
        action = i;
      }
    }
    Q[start_state][action] = -1000;
    if (action == 0) {
      start_x = start_x + 1;
    }
    if (action == 1) {
      start_x = start_x - 1;
    }
    if (action == 2) {
      start_y = start_y + 1;
    }
    if (action == 3) {
      start_y = start_y - 1;
    }
    last_state = findState(start_x, start_y);
    max = -10000;
  }
  std::cout << goal_x << "," << goal_y;
  outfile << std::fixed << goal_x << "   " << std::fixed << goal_y;
  outfile.close();
  return 0;
}